

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O0

ChanopenResult *
ssh2_connection_parse_channel_open
          (ChanopenResult *__return_storage_ptr__,ssh2_connection_state *s,ptrlen type,PktIn *pktin,
          SshChannel *sc)

{
  _Bool _Var1;
  int dstport_00;
  int peerport_00;
  unsigned_long uVar2;
  char *pcVar3;
  ptrlen dstaddr_00;
  ptrlen peeraddr_00;
  ChanopenResult *toret;
  int peerport;
  ptrlen peeraddr;
  int dstport;
  ptrlen dstaddr;
  SshChannel *sc_local;
  PktIn *pktin_local;
  ssh2_connection_state *s_local;
  ptrlen type_local;
  
  _Var1 = ptrlen_eq_string(type,"session");
  if (_Var1) {
    chan_open_session(__return_storage_ptr__,s,sc);
  }
  else {
    _Var1 = ptrlen_eq_string(type,"direct-tcpip");
    if (_Var1) {
      dstaddr_00 = BinarySource_get_string(pktin->binarysource_);
      uVar2 = BinarySource_get_uint32(pktin->binarysource_);
      dstport_00 = toint((uint)uVar2);
      peeraddr_00 = BinarySource_get_string(pktin->binarysource_);
      uVar2 = BinarySource_get_uint32(pktin->binarysource_);
      peerport_00 = toint((uint)uVar2);
      chan_open_direct_tcpip
                (__return_storage_ptr__,s,sc,dstaddr_00,dstport_00,peeraddr_00,peerport_00);
    }
    else {
      __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
      (__return_storage_ptr__->u).failure.reason_code = 3;
      pcVar3 = dupprintf("Unsupported channel type requested");
      (__return_storage_ptr__->u).failure.wire_message = pcVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ChanopenResult ssh2_connection_parse_channel_open(
    struct ssh2_connection_state *s, ptrlen type,
    PktIn *pktin, SshChannel *sc)
{
    if (ptrlen_eq_string(type, "session")) {
        return chan_open_session(s, sc);
    } else if (ptrlen_eq_string(type, "direct-tcpip")) {
        ptrlen dstaddr = get_string(pktin);
        int dstport = toint(get_uint32(pktin));
        ptrlen peeraddr = get_string(pktin);
        int peerport = toint(get_uint32(pktin));
        return chan_open_direct_tcpip(
            s, sc, dstaddr, dstport, peeraddr, peerport);
    } else {
        CHANOPEN_RETURN_FAILURE(
            SSH2_OPEN_UNKNOWN_CHANNEL_TYPE,
            ("Unsupported channel type requested"));
    }
}